

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O0

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,Binary *binary)

{
  bool bVar1;
  element_type *peVar2;
  element_type *e1;
  element_type *e2;
  Binary *binary_local;
  TypeChecker *this_local;
  
  bVar1 = (binary->super_Expr).is_const_;
  peVar2 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &binary->left_);
  peVar2->is_const_ = (bool)(bVar1 & 1);
  bVar1 = (binary->super_Expr).is_const_;
  peVar2 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &binary->right_);
  peVar2->is_const_ = (bool)(bVar1 & 1);
  peVar2 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &binary->left_);
  (*peVar2->_vptr_Expr[2])(peVar2,this);
  peVar2 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &binary->right_);
  (*peVar2->_vptr_Expr[2])(peVar2,this);
  e1 = std::__shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                 (&(binary->left_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>);
  e2 = std::__shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                 (&(binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>);
  MatchTypes(this,e1,e2,false,&binary->super_Expr);
  return;
}

Assistant:

void TypeChecker::Visit(Binary& binary) {
  binary.left_->is_const_ = binary.is_const_;
  binary.right_->is_const_ = binary.is_const_;
  binary.left_->Accept(*this);
  binary.right_->Accept(*this);
  MatchTypes(binary.left_.get(), binary.right_.get(), false, &binary);
}